

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

TestSuite *
iutest::detail::
TypeParamTestInstance<string_assertion_test::iu_StrCaseTest_x_iutest_x_EqRaw_Test,_iutest::detail::VariadicTypeList<char,_wchar_t>_>
::EachTest<iutest::detail::VariadicTypeList<char,_wchar_t>,_void>::AddTestSuite
          (char *testsuite,size_t index,char *file,int line)

{
  UnitTest *this;
  TestSuite *pTVar1;
  undefined4 in_register_0000000c;
  size_t index_00;
  string local_40;
  
  index_00 = CONCAT44(in_register_0000000c,line);
  this = UnitTest::instance();
  MakeIndexTestName_abi_cxx11_(&local_40,(detail *)testsuite,(char *)index,index_00);
  pTVar1 = UnitTestImpl::AddTestSuite<iutest::TypedTestSuite<char>>
                     (&this->super_UnitTestImpl,&local_40,
                      &internal::helper::TestTypeIdHelper<iutest::detail::None>::_dummy,
                      (SetUpMethod)0x0,(TearDownMethod)0x0);
  std::__cxx11::string::~string((string *)&local_40);
  return pTVar1;
}

Assistant:

static TestSuite* AddTestSuite(const char* testsuite, size_t index, const char* file, int line)
        {
#if !defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
            return UnitTest::instance().AddTestSuite<_MyTestSuite>(
#else
            return UnitTest::instance().AddTestSuite(
#endif
#if IUTEST_HAS_TYPED_TEST_APPEND_TYPENAME
                detail::MakeIndexTypedTestName<TypeParam>(testsuite, index)
#else
                detail::MakeIndexTestName(testsuite, index)
#endif
                , internal::GetTypeId<detail::None>()   // TypeId を統一するためダミー引数を渡す
                , IUTEST_GET_SETUP_TESTSUITE(TestBody, file, line)
                , IUTEST_GET_TEARDOWN_TESTSUITE(TestBody, file, line)
#if defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
                , detail::explicit_type<_MyTestSuite>()
#endif
                );
        }